

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateGyro.cpp
# Opt level: O3

bool __thiscall CalibrateGyro::CalculateM(CalibrateGyro *this)

{
  double dVar1;
  bool bVar2;
  CalibrateGyro *__x;
  CalibrateGyro *pCVar3;
  pointer __ptr;
  ulong uVar4;
  int *num_00;
  Vector3d *RotationAngle_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3d RotationAngle [6];
  int num [6];
  undefined1 local_128 [48];
  Vector3d local_f8;
  pointer local_e0;
  pointer pMStack_d8;
  pointer local_d0;
  pointer pMStack_c8;
  pointer local_c0;
  pointer pMStack_b8;
  pointer local_b0;
  pointer local_a8;
  pointer pMStack_a0;
  pointer local_98;
  pointer pMStack_90;
  pointer local_88;
  pointer local_80;
  pointer pMStack_78;
  pointer local_70;
  pointer local_60;
  
  bVar2 = CalculateBias(this);
  if (bVar2) {
    num_00 = (int *)&stack0xffffffffffffffb8;
    RotationAngle_00 = &local_f8;
    uVar4 = 0;
    __x = this;
    do {
      if (uVar4 < 2) {
        pCVar3 = (CalibrateGyro *)&stack0xffffffffffffffa0;
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&stack0xffffffffffffffa0,__x->Gyro_Kinematic);
        CalculateRotation(pCVar3,(VecVector3d *)&stack0xffffffffffffffa0,0,RotationAngle_00,num_00);
        __ptr = local_60;
      }
      else if (uVar4 < 4) {
        pCVar3 = (CalibrateGyro *)(local_128 + 0x18);
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)pCVar3,__x->Gyro_Kinematic);
        CalculateRotation(pCVar3,(VecVector3d *)(local_128 + 0x18),1,RotationAngle_00,num_00);
        __ptr = (pointer)local_128._24_8_;
      }
      else {
        pCVar3 = (CalibrateGyro *)local_128;
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)pCVar3,__x->Gyro_Kinematic);
        CalculateRotation(pCVar3,(VecVector3d *)local_128,2,RotationAngle_00,num_00);
        __ptr = (pointer)local_128._0_8_;
      }
      if (__ptr != (pointer)0x0) {
        free(__ptr);
      }
      uVar4 = uVar4 + 1;
      num_00 = num_00 + 1;
      RotationAngle_00 = RotationAngle_00 + 1;
      __x = (CalibrateGyro *)
            (&__x->Gyro_Kinematic[0].
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            + 1);
    } while (uVar4 != 6);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8]
         = (((double)local_88 - (double)local_70) / 6.283185307179586) * 0.5;
    auVar9 = _DAT_0010c100;
    auVar5._0_8_ = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[0] - (double)local_e0;
    auVar5._8_8_ = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[1] - (double)pMStack_d8;
    auVar5 = divpd(auVar5,_DAT_0010c100);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = auVar5._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = auVar5._8_8_ * 0.5;
    auVar6._0_8_ = (double)local_98 - (double)local_80;
    auVar6._8_8_ = (double)pMStack_90 - (double)pMStack_78;
    auVar5 = divpd(auVar6,auVar9);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6]
         = auVar5._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7]
         = auVar5._8_8_ * 0.5;
    auVar7._0_8_ = local_f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                   m_data.array[2] - (double)local_d0;
    auVar7._8_8_ = (double)pMStack_c8 - (double)local_b0;
    auVar5 = divpd(auVar7,auVar9);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = auVar5._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[3]
         = auVar5._8_8_ * 0.5;
    auVar8._0_8_ = (double)local_c0 - (double)local_a8;
    auVar8._8_8_ = (double)pMStack_b8 - (double)pMStack_a0;
    auVar9 = divpd(auVar8,auVar9);
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4]
         = auVar9._0_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5]
         = auVar9._8_8_ * 0.5;
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9]
         = (this->Bias).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[0];
    dVar1 = (this->Bias).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[2];
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [10] = (this->Bias).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[1];
    (this->M).super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [0xb] = dVar1;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool CalibrateGyro::CalculateM()
{
    bool flag = CalculateBias();
    if(!flag)
        return false;
    Vector3d RotationAngle[6];
    int num[6];
    try
    {
        for(int i = 0; i < 6; ++i)
        {
            if(i <= 1)
                this->CalculateRotation(this->Gyro_Kinematic[i], 0, RotationAngle[i], num[i]);
            else if(i >= 2 && i < 4)
                this->CalculateRotation(this->Gyro_Kinematic[i], 1, RotationAngle[i], num[i]);
            else if(i >= 4 && i < 6)
                this->CalculateRotation(this->Gyro_Kinematic[i], 2, RotationAngle[i], num[i]);
        }
    }
    catch(const std::exception& e)
    {
        std::cout << e.what() << '\n';
        return false;
    }
    
    double PI_2 = PI * 2;
    M(0, 0) = (RotationAngle[0][0] - RotationAngle[1][0]) / PI_2 / 2;   // X axis scale factor
    M(1, 1) = (RotationAngle[2][1] - RotationAngle[3][1]) / PI_2 / 2;   // Y axis scale factor
    M(2, 2) = (RotationAngle[4][2] - RotationAngle[5][2]) / PI_2 / 2;   // Z axis scale factor

    M(0, 1) = (RotationAngle[2][0] - RotationAngle[3][0]) / PI_2 / 2;   // yx
    M(0, 2) = (RotationAngle[4][0] - RotationAngle[5][0]) / PI_2 / 2;   // zx

    M(1, 0) = (RotationAngle[0][1] - RotationAngle[1][1]) / PI_2 / 2;   // xy
    M(1, 2) = (RotationAngle[4][1] - RotationAngle[5][1]) / PI_2 / 2;   // zy

    M(2, 0) = (RotationAngle[0][2] - RotationAngle[1][2]) / PI_2 / 2;   // xz
    M(2, 1) = (RotationAngle[2][2] - RotationAngle[3][2]) / PI_2 / 2;   // yz

    // M.block(0, 0, 3, 3) += Matrix3d::Identity();
    M.block(0, 3, 3, 1) = this->Bias;
    return true;
}